

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2mem.cpp
# Opt level: O1

float vstr_to_float(char *vstr)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char *p;
  byte *pbVar6;
  float fVar7;
  double dVar8;
  double dVar9;
  
  cVar1 = *vstr;
  if ((cVar1 == '-') || (cVar1 == '+')) {
    vstr = vstr + 1;
  }
  bVar2 = *vstr;
  uVar4 = (int)(char)bVar2 - 0x30;
  if (uVar4 < 10) {
    uVar3 = 0;
    do {
      uVar3 = uVar4 + uVar3 * 10;
      bVar2 = ((byte *)vstr)[1];
      vstr = (char *)((byte *)vstr + 1);
      uVar4 = (int)(char)bVar2 - 0x30;
    } while (uVar4 < 10);
    dVar8 = (double)uVar3;
  }
  else {
    dVar8 = 0.0;
  }
  if (bVar2 == 0x2e) {
    pbVar6 = (byte *)vstr + 1;
    vstr = (char *)((byte *)vstr + 1);
    uVar4 = (int)(char)*pbVar6 - 0x30;
    dVar9 = 0.0;
    if (uVar4 < 10) {
      uVar3 = 1;
      uVar5 = 0;
      do {
        uVar5 = uVar4 + uVar5 * 10;
        uVar3 = uVar3 * 10;
        pbVar6 = (byte *)vstr + 1;
        vstr = (char *)((byte *)vstr + 1);
        uVar4 = (int)(char)*pbVar6 - 0x30;
      } while (uVar4 < 10);
      dVar9 = (double)uVar5 / (double)uVar3;
    }
    dVar8 = dVar8 + dVar9;
  }
  if ((byte)(*vstr | 0x20U) == 0x65) {
    bVar2 = ((byte *)vstr)[1];
    if ((bVar2 == 0x2d) || (bVar2 == 0x2b)) {
      pbVar6 = (byte *)vstr + 2;
    }
    else {
      pbVar6 = (byte *)vstr + 1;
    }
    uVar3 = (int)(char)*pbVar6 - 0x30;
    uVar4 = 0;
    if (uVar3 < 10) {
      uVar4 = 0;
      do {
        pbVar6 = pbVar6 + 1;
        uVar4 = uVar3 + uVar4 * 10;
        uVar3 = (int)(char)*pbVar6 - 0x30;
      } while (uVar3 < 10);
    }
    dVar9 = 1.0;
    for (; 7 < uVar4; uVar4 = uVar4 - 8) {
      dVar9 = dVar9 * 100000000.0;
    }
    for (; uVar4 != 0; uVar4 = uVar4 - 1) {
      dVar9 = dVar9 * 10.0;
    }
    if (bVar2 == 0x2d) {
      dVar8 = dVar8 / dVar9;
    }
    else {
      dVar8 = dVar8 * dVar9;
    }
  }
  fVar7 = (float)dVar8;
  if (cVar1 == '-') {
    fVar7 = -fVar7;
  }
  return fVar7;
}

Assistant:

static float vstr_to_float(const char vstr[16])
{
    double v = 0.0;

    const char* p = vstr;

    // sign
    bool sign = *p != '-';
    if (*p == '+' || *p == '-')
    {
        p++;
    }

    // digits before decimal point or exponent
    unsigned int v1 = 0;
    while (isdigit(*p))
    {
        v1 = v1 * 10 + (*p - '0');
        p++;
    }

    v = (double)v1;

    // digits after decimal point
    if (*p == '.')
    {
        p++;

        unsigned int pow10 = 1;
        unsigned int v2 = 0;

        while (isdigit(*p))
        {
            v2 = v2 * 10 + (*p - '0');
            pow10 *= 10;
            p++;
        }

        v += v2 / (double)pow10;
    }

    // exponent
    if (*p == 'e' || *p == 'E')
    {
        p++;

        // sign of exponent
        bool fact = *p != '-';
        if (*p == '+' || *p == '-')
        {
            p++;
        }

        // digits of exponent
        unsigned int expon = 0;
        while (isdigit(*p))
        {
            expon = expon * 10 + (*p - '0');
            p++;
        }

        double scale = 1.0;
        while (expon >= 8)
        {
            scale *= 1e8;
            expon -= 8;
        }
        while (expon > 0)
        {
            scale *= 10.0;
            expon -= 1;
        }

        v = fact ? v * scale : v / scale;
    }

    //     fprintf(stderr, "v = %f\n", v);
    return sign ? (float)v : (float)-v;
}